

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# args.cpp
# Opt level: O0

path * __thiscall ArgsManager::GetBlocksDirPath(ArgsManager *this)

{
  bool bVar1;
  byte bVar2;
  CBaseChainParams *this_00;
  path *path_00;
  ArgsManager *in_RDI;
  long in_FS_OFFSET;
  path *path;
  UniqueLock<AnnotatedMixin<std::recursive_mutex>_> criticalblock7;
  CBaseChainParams *in_stack_fffffffffffffe48;
  ArgsManager *in_stack_fffffffffffffe50;
  path *in_stack_fffffffffffffe58;
  undefined4 in_stack_fffffffffffffe68;
  int in_stack_fffffffffffffe6c;
  ArgsManager *in_stack_fffffffffffffe70;
  string *in_stack_fffffffffffffe78;
  undefined7 in_stack_fffffffffffffe80;
  undefined1 in_stack_fffffffffffffe87;
  UniqueLock<AnnotatedMixin<std::recursive_mutex>_> *in_stack_fffffffffffffe88;
  allocator<char> *__a;
  ArgsManager *this_01;
  undefined1 local_12a [98];
  undefined8 local_c8;
  undefined8 uStack_c0;
  undefined8 local_b8;
  undefined8 uStack_b0;
  undefined8 local_a8;
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  this_01 = in_RDI;
  MaybeCheckNotHeld<AnnotatedMixin<std::recursive_mutex>>
            ((AnnotatedMixin<std::recursive_mutex> *)in_stack_fffffffffffffe48);
  UniqueLock<AnnotatedMixin<std::recursive_mutex>_>::UniqueLock
            (in_stack_fffffffffffffe88,
             (AnnotatedMixin<std::recursive_mutex> *)
             CONCAT17(in_stack_fffffffffffffe87,in_stack_fffffffffffffe80),
             (char *)in_stack_fffffffffffffe78,(char *)in_stack_fffffffffffffe70,
             in_stack_fffffffffffffe6c,SUB41((uint)in_stack_fffffffffffffe68 >> 0x18,0));
  bVar1 = std::filesystem::__cxx11::path::empty((path *)in_stack_fffffffffffffe48);
  if (bVar1) {
    __a = (allocator<char> *)(local_12a + 1);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)this_01,
               (char *)in_RDI,__a);
    bVar2 = IsArgSet(in_stack_fffffffffffffe70,
                     (string *)CONCAT44(in_stack_fffffffffffffe6c,in_stack_fffffffffffffe68));
    std::__cxx11::string::~string
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               in_stack_fffffffffffffe48);
    std::allocator<char>::~allocator((allocator<char> *)(local_12a + 1));
    if ((bVar2 & 1) == 0) {
      GetDataDirBase(in_stack_fffffffffffffe50);
      fs::path::operator=((path *)in_stack_fffffffffffffe58,(path *)in_stack_fffffffffffffe50);
      fs::path::~path((path *)in_stack_fffffffffffffe48);
    }
    else {
      in_stack_fffffffffffffe78 = (string *)local_12a;
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)this_01,
                 (char *)in_RDI,__a);
      local_b8 = 0;
      uStack_b0 = 0;
      local_c8 = 0;
      uStack_c0 = 0;
      local_a8 = 0;
      fs::path::path((path *)in_stack_fffffffffffffe48);
      GetPathArg(this_01,(string *)in_RDI,(path *)__a);
      fs::absolute((path *)in_stack_fffffffffffffe78);
      fs::path::operator=((path *)in_stack_fffffffffffffe58,(path *)in_stack_fffffffffffffe50);
      fs::path::~path((path *)in_stack_fffffffffffffe48);
      fs::path::~path((path *)in_stack_fffffffffffffe48);
      fs::path::~path((path *)in_stack_fffffffffffffe48);
      std::__cxx11::string::~string
                ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 in_stack_fffffffffffffe48);
      std::allocator<char>::~allocator((allocator<char> *)local_12a);
      bVar1 = std::filesystem::is_directory(in_stack_fffffffffffffe58);
      if (!bVar1) {
        fs::path::operator=((path *)in_stack_fffffffffffffe50,(char *)in_stack_fffffffffffffe58);
        fs::path::path((path *)in_stack_fffffffffffffe48,(path *)0x16c9e6);
        goto LAB_0016cb8f;
      }
    }
    this_00 = BaseParams();
    path_00 = (path *)CBaseChainParams::DataDir_abi_cxx11_(in_stack_fffffffffffffe48);
    fs::PathFromString(in_stack_fffffffffffffe78);
    fs::path::operator/=((path *)this_00,path_00);
    fs::path::~path((path *)in_stack_fffffffffffffe48);
    fs::path::operator/=((path *)path_00,(char *)this_00);
    fs::create_directories(path_00);
    fs::path::path((path *)in_stack_fffffffffffffe48,(path *)0x16cb62);
  }
  else {
    fs::path::path((path *)in_stack_fffffffffffffe48,(path *)0x16c829);
  }
LAB_0016cb8f:
  UniqueLock<AnnotatedMixin<std::recursive_mutex>_>::~UniqueLock
            ((UniqueLock<AnnotatedMixin<std::recursive_mutex>_> *)in_stack_fffffffffffffe48);
  if (*(long *)(in_FS_OFFSET + 0x28) != local_8) {
    __stack_chk_fail();
  }
  return (path *)this_01;
}

Assistant:

fs::path ArgsManager::GetBlocksDirPath() const
{
    LOCK(cs_args);
    fs::path& path = m_cached_blocks_path;

    // Cache the path to avoid calling fs::create_directories on every call of
    // this function
    if (!path.empty()) return path;

    if (IsArgSet("-blocksdir")) {
        path = fs::absolute(GetPathArg("-blocksdir"));
        if (!fs::is_directory(path)) {
            path = "";
            return path;
        }
    } else {
        path = GetDataDirBase();
    }

    path /= fs::PathFromString(BaseParams().DataDir());
    path /= "blocks";
    fs::create_directories(path);
    return path;
}